

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc-send-recv.c
# Opt level: O3

int run_ipc_send_recv_tcp(int inprocess)

{
  int iVar1;
  undefined8 uVar2;
  sockaddr_in addr;
  undefined1 auStack_18 [16];
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_18);
  if (iVar1 == 0) {
    ctx.expected_type = UV_TCP;
    uVar2 = uv_default_loop();
    iVar1 = uv_tcp_init(uVar2,0x2e6620);
    if (iVar1 != 0) goto LAB_00161c0b;
    uVar2 = uv_default_loop();
    iVar1 = uv_tcp_init(uVar2,0x2e6758);
    if (iVar1 != 0) goto LAB_00161c10;
    iVar1 = uv_tcp_bind(0x2e6620,auStack_18,0);
    if (iVar1 != 0) goto LAB_00161c15;
    iVar1 = uv_tcp_bind(0x2e6758,auStack_18,0);
    if (iVar1 == 0) {
      run_test(inprocess);
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00161c1f;
    }
  }
  else {
    run_ipc_send_recv_tcp_cold_1();
LAB_00161c0b:
    run_ipc_send_recv_tcp_cold_2();
LAB_00161c10:
    run_ipc_send_recv_tcp_cold_3();
LAB_00161c15:
    run_ipc_send_recv_tcp_cold_4();
  }
  run_ipc_send_recv_tcp_cold_5();
LAB_00161c1f:
  run_ipc_send_recv_tcp_cold_6();
  run_ipc_send_recv_tcp(1);
  return 0;
}

Assistant:

static int run_ipc_send_recv_tcp(int inprocess) {
  struct sockaddr_in addr;
  int r;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  ctx.expected_type = UV_TCP;

  r = uv_tcp_init(uv_default_loop(), &ctx.send.tcp);
  ASSERT(r == 0);

  r = uv_tcp_init(uv_default_loop(), &ctx.send2.tcp);
  ASSERT(r == 0);

  r = uv_tcp_bind(&ctx.send.tcp, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_tcp_bind(&ctx.send2.tcp, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = run_test(inprocess);
  ASSERT(r == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}